

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

filemgr_dirty_update_node * filemgr_dirty_update_new_node(filemgr *file)

{
  atomic<unsigned_long> *paVar1;
  __int_type_conflict _Var2;
  filemgr_dirty_update_node *node;
  
  node = (filemgr_dirty_update_node *)calloc(1,0x50);
  LOCK();
  paVar1 = &file->dirty_update_counter;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  node->id = _Var2 + 1;
  node->immutable = false;
  node->expired = false;
  LOCK();
  (node->ref_count).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  *(undefined4 *)&node->idtree_root = 0xffffffff;
  *(undefined4 *)((long)&node->idtree_root + 4) = 0xffffffff;
  *(undefined4 *)&node->seqtree_root = 0xffffffff;
  *(undefined4 *)((long)&node->seqtree_root + 4) = 0xffffffff;
  avl_init(&node->dirty_blocks,(void *)0x0);
  pthread_spin_lock(&file->dirty_update_lock);
  avl_insert(&file->dirty_update_idx,(avl_node *)node,_dirty_update_idx_cmp);
  pthread_spin_unlock(&file->dirty_update_lock);
  return node;
}

Assistant:

struct filemgr_dirty_update_node *filemgr_dirty_update_new_node(struct filemgr *file)
{
    struct filemgr_dirty_update_node *node;

    node = (struct filemgr_dirty_update_node *)
           calloc(1, sizeof(struct filemgr_dirty_update_node));
    node->id = atomic_incr_uint64_t(&file->dirty_update_counter);
    node->immutable = false; // currently being written
    node->expired = false;
    atomic_init_uint32_t(&node->ref_count, 0);
    node->idtree_root = node->seqtree_root = BLK_NOT_FOUND;
    avl_init(&node->dirty_blocks, NULL);

    spin_lock(&file->dirty_update_lock);
    avl_insert(&file->dirty_update_idx, &node->avl, _dirty_update_idx_cmp);
    spin_unlock(&file->dirty_update_lock);

    return node;
}